

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

double __thiscall embree::BVHN<4>::preBuild(BVHN<4> *this,string *builderName)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  double dVar7;
  Lock<embree::MutexSys> lock;
  
  iVar2 = std::__cxx11::string::compare((char *)builderName);
  if (iVar2 == 0) {
    return INFINITY;
  }
  bVar1 = State::verbosity(&this->device->super_State,2);
  if (bVar1) {
    MutexSys::lock((MutexSys *)&g_printMutex);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"building BVH",0xc);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4);
    lVar4 = std::__cxx11::string::find((char *)builderName,0x1f86039,0);
    pcVar6 = "MB";
    if (lVar4 == -1) {
      pcVar6 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,pcVar6,(ulong)((uint)(lVar4 != -1) * 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<",1);
    pcVar6 = (char *)(**(code **)**(undefined8 **)&(this->super_AccelData).field_0x58)();
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> using ",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(builderName->_M_dataplus)._M_p,builderName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ...",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
    MutexSys::unlock((MutexSys *)&g_printMutex);
  }
  if (((this->device->super_State).benchmark == 0) &&
     (bVar1 = State::verbosity(&this->device->super_State,2), !bVar1)) {
    return 0.0;
  }
  dVar7 = getSeconds();
  return dVar7;
}

Assistant:

double BVHN<N>::preBuild(const std::string& builderName)
  {
    if (builderName == "") 
      return inf;

    if (device->verbosity(2))
    {
      Lock<MutexSys> lock(g_printMutex);
      std::cout << "building BVH" << N << (builderName.find("MBlur") != std::string::npos ? "MB" : "") << "<" << primTy->name() << "> using " << builderName << " ..." << std::endl << std::flush;
    }

    double t0 = 0.0;
    if (device->benchmark || device->verbosity(2)) t0 = getSeconds();
    return t0;
  }